

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.hpp
# Opt level: O2

void __thiscall helics::CloneOperator::~CloneOperator(CloneOperator *this)

{
  (this->super_FilterOperator)._vptr_FilterOperator = (_func_int **)&PTR__CloneOperator_004cb370;
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->evalFunction);
  return;
}

Assistant:

class HELICS_CXX_EXPORT CloneOperator: public FilterOperator {
  public:
    /** default constructor*/
    CloneOperator() = default;
    /** set the function to modify the data of the message in the constructor*/
    explicit CloneOperator(
        std::function<std::vector<std::unique_ptr<Message>>(const Message*)> userCloneFunction);
    /** set the function to modify the data of the message*/
    void setCloneFunction(
        std::function<std::vector<std::unique_ptr<Message>>(const Message*)> userCloneFunction);
    virtual bool isMessageGenerating() const override { return true; }

  private:
    std::function<std::vector<std::unique_ptr<Message>>(const Message*)>
        evalFunction;  //!< the function actually doing the processing
    virtual std::unique_ptr<Message> process(std::unique_ptr<Message> message) override;
    virtual std::vector<std::unique_ptr<Message>>
        processVector(std::unique_ptr<Message> message) override;
}